

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int get_next_gm_job(AV1_COMP *cpi,int *frame_idx,int cur_dir)

{
  int8_t *piVar1;
  int iVar2;
  
  iVar2 = (int)(cpi->mt_info).gm_sync.job_info.next_frame_to_process[cur_dir];
  if ((iVar2 < (cpi->gm_info).num_ref_frames[cur_dir]) &&
     ((cpi->mt_info).gm_sync.job_info.early_exit[cur_dir] == '\0')) {
    *frame_idx = (int)(cpi->gm_info).reference_frames[cur_dir][iVar2].frame;
    piVar1 = (cpi->mt_info).gm_sync.job_info.next_frame_to_process + cur_dir;
    *piVar1 = *piVar1 + '\x01';
    return 1;
  }
  return 0;
}

Assistant:

static inline int get_next_gm_job(AV1_COMP *cpi, int *frame_idx, int cur_dir) {
  GlobalMotionInfo *gm_info = &cpi->gm_info;
  GlobalMotionJobInfo *job_info = &cpi->mt_info.gm_sync.job_info;

  int total_refs = gm_info->num_ref_frames[cur_dir];
  int8_t cur_frame_to_process = job_info->next_frame_to_process[cur_dir];

  if (cur_frame_to_process < total_refs && !job_info->early_exit[cur_dir]) {
    *frame_idx = gm_info->reference_frames[cur_dir][cur_frame_to_process].frame;
    job_info->next_frame_to_process[cur_dir] += 1;
    return 1;
  }
  return 0;
}